

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O3

bool __thiscall SRUP_MSG::Verify(SRUP_MSG *this,char *key)

{
  bool bVar1;
  int iVar2;
  SRUP_Crypto Crypto;
  SRUP_Crypto SStack_48;
  
  iVar2 = (*this->_vptr_SRUP_MSG[9])();
  bVar1 = false;
  if ((key != (char *)0x0) && (bVar1 = false, (char)iVar2 != '\0')) {
    SRUP_Crypto::SRUP_Crypto(&SStack_48);
    SRUP_Crypto::signature(&SStack_48,this->m_signature,this->m_sig_len);
    (*this->_vptr_SRUP_MSG[10])(this,1);
    bVar1 = SRUP_Crypto::Verify(&SStack_48,this->m_unsigned_message,(ulong)this->m_unsigned_length,
                                key);
    SRUP_Crypto::~SRUP_Crypto(&SStack_48);
  }
  return bVar1;
}

Assistant:

bool SRUP_MSG::Verify(char *key)
{
    if (!DataCheck())
        return false;

    if (key == nullptr)
        return false;

    SRUP_Crypto Crypto;
    Crypto.signature(m_signature, m_sig_len);
    Serialize(true);
    return Crypto.Verify(m_unsigned_message, m_unsigned_length, key);
}